

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

greatest_test_res generic_pack_unpack_le_i16_should_match(void)

{
  uint64_t uVar1;
  short local_12;
  undefined1 local_10 [2];
  int16_t local_e;
  greatest_test_res gStack_c;
  int16_t unpack;
  uint8_t buf [2];
  int16_t wrote;
  
  uVar1 = random_unique();
  local_e = (int16_t)uVar1;
  pack_le_i16(local_10,local_e);
  unpack_le_i16(&local_12,local_10);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (local_e == local_12) {
    greatest_info.msg = (char *)0x0;
    gStack_c = GREATEST_TEST_RES_PASS;
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
    ;
    greatest_info.fail_line = 0x1b0;
    greatest_info.msg = "wrote != unpack";
    gStack_c = GREATEST_TEST_RES_FAIL;
  }
  return gStack_c;
}

Assistant:

TEST
generic_pack_unpack_le_i16_should_match(void) {
    int16_t wrote = random_unique();
    uint8_t buf[sizeof(wrote)];
    pack_le_i16(buf, wrote);
    int16_t unpack;
    unpack_le_i16(&unpack, buf);
    ASSERT_EQ(wrote, unpack);
    PASS();
}